

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O0

int res(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector resval,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  sunrealtype *rval;
  sunrealtype yp2;
  sunrealtype yp1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  
  dVar1 = **(double **)(*in_RDI + 0x10);
  dVar2 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar3 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  dVar4 = **(double **)(*in_RSI + 0x10);
  dVar5 = *(double *)(*(long *)(*in_RSI + 0x10) + 8);
  pdVar7 = (double *)N_VGetArrayPointer(in_RDX);
  dVar6 = in_RCX[2];
  *pdVar7 = *in_RCX * dVar1 + -(in_RCX[1] * dVar2 * dVar3);
  pdVar7[1] = dVar6 * dVar2 * dVar2 + -*pdVar7 + dVar5;
  *pdVar7 = dVar4 + *pdVar7;
  pdVar7[2] = (dVar1 + dVar2 + dVar3) - 1.0;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector resval,
               void* user_data)
{
  sunrealtype y1, y2, y3, yp1, yp2, *rval;
  UserData data;
  sunrealtype p1, p2, p3;

  y1   = Ith(yy, 1);
  y2   = Ith(yy, 2);
  y3   = Ith(yy, 3);
  yp1  = Ith(yp, 1);
  yp2  = Ith(yp, 2);
  rval = N_VGetArrayPointer(resval);

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  rval[0] = p1 * y1 - p2 * y2 * y3;
  rval[1] = -rval[0] + p3 * y2 * y2 + yp2;
  rval[0] += yp1;
  rval[2] = y1 + y2 + y3 - 1;

  return (0);
}